

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Rational * __thiscall Matrix<Rational>::det(Matrix<Rational> *this)

{
  uint uVar1;
  undefined8 uVar2;
  int *in_RSI;
  Rational *in_RDI;
  Rational *unaff_retaddr;
  uint i;
  Matrix<Rational> tmp;
  Rational *ans;
  Matrix<Rational> *in_stack_00000200;
  Matrix<Rational> *in_stack_00000208;
  char *in_stack_ffffffffffffff88;
  matrix_error *in_stack_ffffffffffffff90;
  Rational *this_00;
  Matrix<Rational> *in_stack_ffffffffffffffa0;
  uint local_3c;
  Rational *a;
  
  if (in_RSI[1] != *in_RSI) {
    uVar2 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    __cxa_throw(uVar2,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  this_00 = (Rational *)&stack0xffffffffffffffd0;
  a = in_RDI;
  Matrix((Matrix<Rational> *)in_RDI,(Matrix<Rational> *)in_RDI);
  uVar1 = gauss(in_stack_00000208,in_stack_00000200);
  if (uVar1 == in_RSI[1]) {
    Rational::Rational(this_00,(longlong)in_stack_ffffffffffffff88);
    for (local_3c = 0; local_3c < (uint)(in_RSI[1] * in_RSI[1]); local_3c = in_RSI[1] + 1 + local_3c
        ) {
      Rational::operator*=(unaff_retaddr,a);
    }
  }
  else {
    Rational::Rational(this_00);
  }
  ~Matrix(in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

const Field Matrix<Field>::det() const
{
    if(N != M)
        throw matrix_error("Trying to calculate determinant of a non-square matrix");
    Matrix tmp(*this);
    if(tmp.gauss() != N)
        return Field();
    Field ans = 1;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans *= tmp.arr[i];
    }
    return ans;
}